

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

error_code __thiscall
simdjson::dom::parser::ensure_capacity
          (parser *this,document *target_document,size_t desired_capacity)

{
  bool bVar1;
  size_t sVar2;
  pointer pdVar3;
  error_code local_b4;
  size_t local_b0;
  ulong local_98;
  error_code local_88;
  ulong local_80;
  error_code err2;
  error_code err1;
  size_t desired_capacity_local;
  document *target_document_local;
  parser *this_local;
  
  _err2 = desired_capacity;
  if (desired_capacity < 0x20) {
    _err2 = 0x20;
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->implementation);
  if (bVar1) {
    pdVar3 = std::
             unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
             ::operator->(&this->implementation);
    local_80 = pdVar3->_capacity;
  }
  else {
    local_80 = 0;
  }
  bVar1 = true;
  if (_err2 <= local_80) {
    sVar2 = document::capacity(target_document);
    bVar1 = sVar2 < _err2;
  }
  if (bVar1) {
    if (this->_max_capacity < _err2) {
      this->error = CAPACITY;
      return CAPACITY;
    }
    sVar2 = document::capacity(target_document);
    if (sVar2 < _err2) {
      local_88 = document::allocate(target_document,_err2);
    }
    else {
      local_88 = SUCCESS;
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->implementation);
    if (bVar1) {
      pdVar3 = std::
               unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
               ::operator->(&this->implementation);
      local_98 = pdVar3->_capacity;
    }
    else {
      local_98 = 0;
    }
    if (local_98 < _err2) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->implementation);
      if (bVar1) {
        pdVar3 = std::
                 unique_ptr<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                 ::operator->(&this->implementation);
        local_b0 = pdVar3->_max_depth;
      }
      else {
        local_b0 = 0x400;
      }
      local_b4 = allocate(this,_err2,local_b0);
    }
    else {
      local_b4 = SUCCESS;
    }
    if (local_88 != SUCCESS) {
      this->error = local_88;
      return local_88;
    }
    if (local_b4 != SUCCESS) {
      this->error = local_b4;
      return local_b4;
    }
  }
  return SUCCESS;
}

Assistant:

inline error_code parser::ensure_capacity(document& target_document, size_t desired_capacity) noexcept {
  // 1. It is wasteful to allocate a document and a parser for documents spanning less than MINIMAL_DOCUMENT_CAPACITY bytes.
  // 2. If we allow desired_capacity = 0 then it is possible to exit this function with implementation == nullptr.
  if(desired_capacity < MINIMAL_DOCUMENT_CAPACITY) { desired_capacity = MINIMAL_DOCUMENT_CAPACITY; }
  // If we don't have enough capacity, (try to) automatically bump it.
  // If the document needs allocation, do it too.
  // Both in one if statement to minimize unlikely branching.
  //
  // Note: we must make sure that this function is called if capacity() == 0. We do so because we
  // ensure that desired_capacity > 0.
  if (simdjson_unlikely(capacity() < desired_capacity || target_document.capacity() < desired_capacity)) {
    if (desired_capacity > max_capacity()) {
      return error = CAPACITY;
    }
    error_code err1 = target_document.capacity() < desired_capacity ? target_document.allocate(desired_capacity) : SUCCESS;
    error_code err2 = capacity() < desired_capacity ? allocate(desired_capacity, max_depth()) : SUCCESS;
    if(err1 != SUCCESS) { return error = err1; }
    if(err2 != SUCCESS) { return error = err2; }
  }
  return SUCCESS;
}